

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppNVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  pointer pnVar7;
  Item *pIVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  pointer pnVar22;
  uint *puVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  uint *puVar26;
  uint uVar27;
  byte bVar28;
  Real RVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x0;
  fpclass_type local_358;
  cpp_dec_float<200U,_int,_void> local_328;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  uint local_248 [3];
  undefined3 uStack_23b;
  int iStack_238;
  bool bStack_234;
  undefined8 local_230;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_220;
  long local_218;
  cpp_dec_float<200U,_int,_void> local_210;
  cpp_dec_float<200U,_int,_void> local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar28 = 0;
  uVar4 = (x->super_IdxSet).num;
  if ((ulong)uVar4 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
  iVar12 = *(x->super_IdxSet).idx;
  local_220 = x;
  pnVar7 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar23 = (uint *)(pnVar7 + iVar12);
  pcVar24 = &local_190;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pcVar24->data)._M_elems[0] = *puVar23;
    puVar23 = puVar23 + 1;
    pcVar24 = (cpp_dec_float<200U,_int,_void> *)((pcVar24->data)._M_elems + 1);
  }
  iVar11 = pnVar7[iVar12].m_backend.exp;
  local_190.exp = iVar11;
  bVar2 = pnVar7[iVar12].m_backend.neg;
  local_190.neg = bVar2;
  fVar5 = pnVar7[iVar12].m_backend.fpclass;
  local_190.fpclass = fVar5;
  iVar6 = pnVar7[iVar12].m_backend.prec_elem;
  local_190.prec_elem = iVar6;
  pIVar8 = (A->set).theitem;
  local_228 = A;
  iVar12 = (A->set).thekey[iVar12].idx;
  *(int *)(this + 8) =
       pIVar8[iVar12].data.
       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .memused;
  pcVar24 = &local_190;
  pcVar21 = &local_328;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pcVar21->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
    pcVar24 = (cpp_dec_float<200U,_int,_void> *)((pcVar24->data)._M_elems + 1);
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((pcVar21->data)._M_elems + 1);
  }
  RVar29 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  local_328.exp = iVar11;
  local_328.neg = bVar2;
  local_328.prec_elem = iVar6;
  local_328.fpclass = fVar5;
  if ((bVar2 == true) && (local_328.data._M_elems[0] != 0 || fVar5 != cpp_dec_float_finite)) {
    local_328.neg = false;
  }
  bVar2 = false;
  if ((fVar5 != cpp_dec_float_NaN) && (bVar2 = false, !NAN(RVar29))) {
    local_230._0_4_ = cpp_dec_float_finite;
    local_230._4_4_ = 0x1c;
    local_2a8 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    local_288 = (undefined1  [16])0x0;
    local_278 = (undefined1  [16])0x0;
    local_268 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_248[0] = 0;
    local_248[1] = 0;
    stack0xfffffffffffffdc0 = 0;
    uStack_23b = 0;
    iStack_238 = 0;
    bStack_234 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_2a8,RVar29);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
    bVar2 = iVar11 < 1;
  }
  if (*(int *)(this + 8) == 0 || bVar2) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
  }
  else if (0 < *(int *)(this + 8)) {
    lVar16 = 0;
    lVar19 = 0;
    uVar27 = 0;
    do {
      pNVar9 = pIVar8[iVar12].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar9->val).m_backend.data + lVar16);
      local_328.fpclass = cpp_dec_float_finite;
      local_328.prec_elem = 0x1c;
      local_328.data._M_elems[0] = 0;
      local_328.data._M_elems[1] = 0;
      local_328.data._M_elems[2] = 0;
      local_328.data._M_elems[3] = 0;
      local_328.data._M_elems[4] = 0;
      local_328.data._M_elems[5] = 0;
      local_328.data._M_elems[6] = 0;
      local_328.data._M_elems[7] = 0;
      local_328.data._M_elems[8] = 0;
      local_328.data._M_elems[9] = 0;
      local_328.data._M_elems[10] = 0;
      local_328.data._M_elems[0xb] = 0;
      local_328.data._M_elems[0xc] = 0;
      local_328.data._M_elems[0xd] = 0;
      local_328.data._M_elems[0xe] = 0;
      local_328.data._M_elems[0xf] = 0;
      local_328.data._M_elems[0x10] = 0;
      local_328.data._M_elems[0x11] = 0;
      local_328.data._M_elems[0x12] = 0;
      local_328.data._M_elems[0x13] = 0;
      local_328.data._M_elems[0x14] = 0;
      local_328.data._M_elems[0x15] = 0;
      local_328.data._M_elems[0x16] = 0;
      local_328.data._M_elems[0x17] = 0;
      local_328.data._M_elems[0x18] = 0;
      local_328.data._M_elems[0x19] = 0;
      local_328.data._M_elems._104_5_ = 0;
      local_328.data._M_elems[0x1b]._1_3_ = 0;
      local_328.exp = 0;
      local_328.neg = false;
      pcVar21 = &local_190;
      if (pcVar24 != &local_328) {
        pcVar25 = &local_328;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar28 * -8 + 4);
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar28 * -8 + 4);
        }
        local_328.exp = local_190.exp;
        local_328.neg = local_190.neg;
        local_328.prec_elem = local_190.prec_elem;
        local_328.fpclass = local_190.fpclass;
        pcVar21 = pcVar24;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_328,pcVar21);
      iVar11 = *(int *)((long)(&pNVar9->val + 1) + lVar16);
      *(int *)(*(long *)(this + 0x10) + (ulong)uVar27 * 4) = iVar11;
      lVar14 = *(long *)(this + 0x20);
      lVar18 = (long)iVar11 * 0x80;
      pcVar24 = &local_328;
      puVar23 = (uint *)(lVar14 + lVar18);
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar23 = (pcVar24->data)._M_elems[0];
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar28 * -8 + 4);
        puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
      }
      *(int *)(lVar14 + 0x70 + lVar18) = local_328.exp;
      *(bool *)(lVar14 + 0x74 + lVar18) = local_328.neg;
      *(undefined8 *)(lVar14 + 0x78 + lVar18) = local_328._120_8_;
      uVar15 = 1;
      if (local_328.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_2a8,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
        uVar15 = (uint)(iVar11 != 0);
      }
      uVar27 = uVar27 + uVar15;
      lVar19 = lVar19 + 1;
      lVar16 = lVar16 + 0x84;
    } while (lVar19 < *(int *)(this + 8));
    goto LAB_0051ca77;
  }
  uVar27 = 0;
LAB_0051ca77:
  if (1 < (int)uVar4) {
    uVar20 = 1;
    do {
      iVar12 = (local_220->super_IdxSet).idx[uVar20];
      pnVar7 = (local_220->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar22 = pnVar7 + iVar12;
      pcVar24 = &local_210;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar24->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      iVar11 = pnVar7[iVar12].m_backend.exp;
      local_210.exp = iVar11;
      bVar2 = pnVar7[iVar12].m_backend.neg;
      local_210.neg = bVar2;
      fVar5 = pnVar7[iVar12].m_backend.fpclass;
      local_210.fpclass = fVar5;
      iVar6 = pnVar7[iVar12].m_backend.prec_elem;
      local_210.prec_elem = iVar6;
      pIVar8 = (local_228->set).theitem;
      lVar16 = (long)(local_228->set).thekey[iVar12].idx;
      local_218 = lVar16 * 5;
      uVar15 = pIVar8[lVar16].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      pcVar24 = &local_210;
      puVar23 = local_110;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar23 = (pcVar24->data)._M_elems[0];
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + ((ulong)bVar28 * -2 + 1) * 4);
        puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
      }
      RVar29 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      puVar23 = local_110;
      pcVar24 = &local_328;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar24->data)._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar28 * -8 + 4);
      }
      local_328.exp = iVar11;
      local_328.neg = bVar2;
      local_328.prec_elem = iVar6;
      local_328.fpclass = fVar5;
      if ((bVar2 == true) && (local_328.data._M_elems[0] != 0 || fVar5 != cpp_dec_float_finite)) {
        local_328.neg = false;
      }
      if ((fVar5 != cpp_dec_float_NaN) && (!NAN(RVar29))) {
        local_230._0_4_ = cpp_dec_float_finite;
        local_230._4_4_ = 0x1c;
        local_2a8 = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = (undefined1  [16])0x0;
        local_278 = (undefined1  [16])0x0;
        local_268 = (undefined1  [16])0x0;
        local_258 = (undefined1  [16])0x0;
        local_248[0] = 0;
        local_248[1] = 0;
        stack0xfffffffffffffdc0 = 0;
        uStack_23b = 0;
        iStack_238 = 0;
        bStack_234 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_2a8,RVar29);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
        if ((0 < iVar12) && (0 < (int)uVar15)) {
          ppNVar1 = &(pIVar8->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem + local_218;
          lVar16 = 0;
          do {
            pNVar9 = *ppNVar1;
            iVar12 = *(int *)((long)(&pNVar9->val + 1) + lVar16);
            *(int *)(*(long *)(this + 0x10) + (long)(int)uVar27 * 4) = iVar12;
            lVar19 = *(long *)(this + 0x20);
            lVar14 = (long)iVar12 * 0x80;
            puVar23 = (uint *)(lVar19 + lVar14);
            pcVar24 = &local_328;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pcVar24->data)._M_elems[0] = *puVar23;
              puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar28 * -8 + 4);
            }
            local_328.exp = *(int *)(lVar19 + 0x70 + lVar14);
            local_328.neg = (bool)*(char *)(lVar19 + 0x74 + lVar14);
            uVar10 = *(undefined8 *)(lVar19 + 0x78 + lVar14);
            local_328.fpclass = (fpclass_type)uVar10;
            local_328.prec_elem = SUB84(uVar10,4);
            if ((fpclass_type)uVar10 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_2a8,0,(type *)0x0);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
              uVar27 = uVar27 + (iVar12 == 0);
            }
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&(pNVar9->val).m_backend.data + lVar16);
            local_230._0_4_ = cpp_dec_float_finite;
            local_230._4_4_ = 0x1c;
            local_2a8 = ZEXT816(0);
            local_298 = ZEXT816(0);
            local_288 = ZEXT816(0);
            local_278 = ZEXT816(0);
            local_268 = ZEXT816(0);
            local_258 = ZEXT816(0);
            local_248[0] = 0;
            local_248[1] = 0;
            stack0xfffffffffffffdc0 = 0;
            uStack_23b = 0;
            iStack_238 = 0;
            bStack_234 = false;
            pcVar24 = &local_210;
            if (pcVar21 != (cpp_dec_float<200U,_int,_void> *)local_2a8) {
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_2a8;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                (pcVar25->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar28 * -8 + 4)
                ;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar28 * -8 + 4)
                ;
              }
              iStack_238 = local_210.exp;
              bStack_234 = local_210.neg;
              local_230._4_4_ = local_210.prec_elem;
              local_230._0_4_ = local_210.fpclass;
              pcVar24 = pcVar21;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_2a8,pcVar24);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
            if (local_328.fpclass == cpp_dec_float_NaN) {
LAB_0051cdd0:
              lVar19 = *(long *)(this + 0x20);
              lVar14 = (long)(int)pcVar21[1].data._M_elems[0] * 0x80;
              pcVar24 = &local_328;
              puVar23 = (uint *)(lVar19 + lVar14);
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                *puVar23 = (pcVar24->data)._M_elems[0];
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar28 * -8 + 4)
                ;
                puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
              }
              *(int *)(lVar19 + 0x70 + lVar14) = local_328.exp;
              *(bool *)(lVar19 + 0x74 + lVar14) = local_328.neg;
              *(undefined8 *)(lVar19 + 0x78 + lVar14) = local_328._120_8_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_2a8,0,(type *)0x0);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
              if (iVar12 != 0) goto LAB_0051cdd0;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)
                         ((long)(int)pcVar21[1].data._M_elems[0] * 0x80 + *(long *)(this + 0x20)),
                         1e-100);
            }
            lVar16 = lVar16 + 0x84;
          } while ((ulong)uVar15 * 0x84 != lVar16);
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar4);
  }
  if (0 < (int)uVar27) {
    uVar20 = 0;
    iVar12 = 0;
    do {
      lVar16 = *(long *)(this + 0x20);
      iVar11 = *(int *)(*(long *)(this + 0x10) + uVar20 * 4);
      lVar14 = (long)iVar11 * 0x80;
      puVar23 = (uint *)(lVar16 + lVar14);
      puVar26 = local_a0;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar26 = *puVar23;
        puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
        puVar26 = puVar26 + (ulong)bVar28 * -2 + 1;
      }
      iVar13 = *(int *)(lVar16 + 0x70 + lVar14);
      cVar3 = *(char *)(lVar16 + 0x74 + lVar14);
      uVar10 = *(undefined8 *)(lVar16 + 0x78 + lVar14);
      RVar29 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      puVar23 = local_a0;
      pcVar24 = &local_328;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar24->data)._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar28 * -8 + 4);
      }
      local_358 = (fpclass_type)uVar10;
      local_328.neg = (bool)cVar3;
      if ((cVar3 == '\x01') &&
         (local_328.data._M_elems[0] != 0 || local_358 != cpp_dec_float_finite)) {
        local_328.neg = false;
      }
      local_328.exp = iVar13;
      local_328._120_8_ = uVar10;
      if ((local_358 == cpp_dec_float_NaN) || (NAN(RVar29))) {
LAB_0051cfc5:
        *(int *)(*(long *)(this + 0x10) + (long)iVar12 * 4) = iVar11;
        iVar12 = iVar12 + 1;
      }
      else {
        local_230._0_4_ = cpp_dec_float_finite;
        local_230._4_4_ = 0x1c;
        local_2a8 = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = (undefined1  [16])0x0;
        local_278 = (undefined1  [16])0x0;
        local_268 = (undefined1  [16])0x0;
        local_258 = (undefined1  [16])0x0;
        local_248[0] = 0;
        local_248[1] = 0;
        stack0xfffffffffffffdc0 = 0;
        uStack_23b = 0;
        iStack_238 = 0;
        bStack_234 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_2a8,RVar29);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_328,(cpp_dec_float<200U,_int,_void> *)local_2a8);
        if (0 < iVar13) goto LAB_0051cfc5;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)(lVar14 + *(long *)(this + 0x20)),0);
      }
      *(int *)(this + 8) = iVar12;
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productShort(const SVSetBase<S>& A,
      const SSVectorBase<T>& x)
{
   assert(x.isSetup());

   if(x.size() == 0)   // x can be setup but have size 0 => this := zero vector
   {
      clear();
      return *this;
   }

   // compute x[0] * A[0]
   int curidx = x.idx[0];
   const T x0 = x.val[curidx];
   const SVectorBase<S>& A0 = A[curidx];
   int nonzero_idx = 0;
   int xsize = x.size();
   int Aisize;

   num = A0.size();

   if(isZero(x0, this->tolerances()->epsilon()) || num == 0)
   {
      // A[0] == 0 or x[0] == 0 => this := zero vector
      clear();
   }
   else
   {
      for(int j = 0; j < num; ++j)
      {
         const Nonzero<S>& elt = A0.element(j);
         const R product = x0 * elt.val;

         // store the value in any case
         idx[nonzero_idx] = elt.idx;
         VectorBase<R>::val[elt.idx] = product;

         // count only non-zero values; not 'isNotZero(product, epsilon)'
         if(product != 0)
            ++nonzero_idx;
      }
   }

   // Compute the other x[i] * A[i] and add them to the existing vector.
   for(int i = 1; i < xsize; ++i)
   {
      curidx = x.idx[i];
      const T xi     = x.val[curidx];
      const SVectorBase<S>& Ai = A[curidx];

      // If A[i] == 0 or x[i] == 0, do nothing.
      Aisize = Ai.size();

      if(isNotZero(xi, this->tolerances()->epsilon()) || Aisize == 0)
      {
         // Compute x[i] * A[i] and add it to the existing vector.
         for(int j = 0; j < Aisize; ++j)
         {
            const Nonzero<S>& elt = Ai.element(j);
            idx[nonzero_idx] = elt.idx;
            R oldval  = VectorBase<R>::val[elt.idx];

            // An old value of exactly 0 means the position is still unused.
            // It will be used now (either by a new nonzero or by a SOPLEX_VECTOR_MARKER),
            // so increase the counter. If oldval != 0, we just
            // change an existing NZ-element, so don't increase the counter.
            if(oldval == 0)
               ++nonzero_idx;

            // Add the current product x[i] * A[i][j]; if oldval was
            // SOPLEX_VECTOR_MARKER before, it does not hurt because SOPLEX_VECTOR_MARKER is really small.
            oldval += xi * elt.val;

            // If the new value is exactly 0, mark the index as used
            // by setting a value which is nearly 0; otherwise, store
            // the value. Values below epsilon will be removed later.
            if(oldval == 0)
               VectorBase<R>::val[elt.idx] = SOPLEX_VECTOR_MARKER;
            else
               VectorBase<R>::val[elt.idx] = oldval;
         }
      }
   }

   // Clean up by shifting all nonzeros (w.r.t. epsilon) to the front of idx,
   // zeroing all values which are nearly 0, and setting #num# appropriately.
   int nz_counter = 0;

   for(int i = 0; i < nonzero_idx; ++i)
   {
      curidx = idx[i];

      if(isZero(VectorBase<R>::val[curidx], this->tolerances()->epsilon()))
         VectorBase<R>::val[curidx] = 0;
      else
      {
         idx[nz_counter] = curidx;
         ++nz_counter;
      }

      num = nz_counter;
   }

   assert(isConsistent());

   return *this;
}